

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QString> * __thiscall QList<QString>::mid(QList<QString> *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  QArrayDataPointer<QString> *other;
  const_pointer pQVar2;
  long in_RDX;
  long in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  DataPointer copied;
  qsizetype l;
  qsizetype p;
  QList<QString> *in_stack_ffffffffffffff68;
  QList<QString> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QString> *this_00;
  QList<QString> *this_01;
  undefined4 in_stack_ffffffffffffff90;
  QArrayDataPointer<QString> local_30;
  qsizetype local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  local_10 = in_RDX;
  CVar1 = QtPrivate::QContainerImplHelper::mid(*(qsizetype *)(in_RSI + 0x10),&local_10,&local_18);
  if (CVar1 < Full) {
    memset(in_RDI,0,0x18);
    QList((QList<QString> *)0x30b958);
  }
  else if (CVar1 == Full) {
    QList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_30.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_30.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_30.size = -0x5555555555555556;
    QArrayDataPointer<QString>::QArrayDataPointer
              ((QArrayDataPointer<QString> *)CONCAT44(CVar1,in_stack_ffffffffffffff90),in_RSI,
               (qsizetype)this_01,(AllocationOption)((ulong)in_RDI >> 0x20));
    other = (QArrayDataPointer<QString> *)QArrayDataPointer<QString>::operator->(&local_30);
    pQVar2 = data((QList<QString> *)0x30b9ca);
    this_00 = (QArrayDataPointer<QString> *)(pQVar2 + local_10);
    data((QList<QString> *)0x30b9e5);
    QtPrivate::QGenericArrayOps<QString>::copyAppend
              ((QGenericArrayOps<QString> *)this_01,(QString *)in_RDI,(QString *)this_00);
    QArrayDataPointer<QString>::QArrayDataPointer(this_00,other);
    QList((QList<QString> *)this_00,other);
    QArrayDataPointer<QString>::~QArrayDataPointer(this_00);
    QArrayDataPointer<QString>::~QArrayDataPointer(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}